

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uchar uVar4;
  int iVar5;
  uchar *puVar6;
  void *__src;
  long lVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  uchar *puVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  size_t sVar18;
  uchar *puVar19;
  int iVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  int data_len;
  bool bVar26;
  int zlen;
  int local_d8;
  int local_cc;
  uint local_3c;
  uint *local_38;
  
  uVar25 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar25;
  }
  data_len = (uVar25 + 1) * y;
  puVar6 = (uchar *)malloc((long)data_len);
  if (puVar6 != (uchar *)0x0) {
    sVar18 = (size_t)(int)uVar25;
    __src = malloc(sVar18);
    if (__src == (void *)0x0) {
      free(puVar6);
    }
    else {
      lVar7 = (long)n;
      if (0 < y) {
        lVar10 = (long)stride_bytes;
        lVar13 = (long)pixels - lVar10;
        puVar19 = pixels + lVar7;
        puVar11 = pixels + (lVar7 - lVar10);
        uVar22 = 0;
        do {
          piVar21 = stbi_write_png_to_mem::mapping;
          if (uVar22 == 0) {
            piVar21 = stbi_write_png_to_mem::firstmap;
          }
          local_cc = 0x7fffffff;
          local_d8 = 0;
          iVar20 = 0;
          do {
            iVar5 = local_d8;
            if (iVar20 == 0) {
              iVar5 = 0;
            }
            if (iVar5 < 5) {
              lVar8 = (long)iVar5;
              do {
                iVar5 = piVar21[lVar8];
                if (0 < n) {
                  uVar23 = 0;
                  do {
                    switch(iVar5) {
                    case 0:
                    case 1:
                    case 5:
                    case 6:
                      uVar4 = pixels[uVar23];
                      break;
                    case 2:
                    case 4:
                      uVar4 = pixels[uVar23] - *(char *)(lVar13 + uVar23);
                      break;
                    case 3:
                      uVar4 = pixels[uVar23] - (*(byte *)(lVar13 + uVar23) >> 1);
                      break;
                    default:
                      goto switchD_00113184_default;
                    }
                    *(uchar *)((long)__src + uVar23) = uVar4;
switchD_00113184_default:
                    uVar23 = uVar23 + 1;
                  } while ((uint)n != uVar23);
                }
                if (n < (int)uVar25) {
                  lVar24 = 0;
                  do {
                    switch(iVar5) {
                    case 0:
                      uVar4 = puVar19[lVar24];
                      break;
                    case 1:
                    case 6:
                      uVar4 = puVar19[lVar24] - pixels[lVar24];
                      break;
                    case 2:
                      uVar4 = puVar19[lVar24] - puVar11[lVar24];
                      break;
                    case 3:
                      uVar4 = puVar19[lVar24] -
                              (char)((uint)puVar11[lVar24] + (uint)pixels[lVar24] >> 1);
                      break;
                    case 4:
                      bVar14 = pixels[lVar24];
                      bVar1 = puVar11[lVar24];
                      bVar9 = *(byte *)(lVar13 + lVar24);
                      iVar16 = ((uint)bVar1 + (uint)bVar14) - (uint)bVar9;
                      uVar15 = iVar16 - (uint)bVar14;
                      uVar2 = -uVar15;
                      if (0 < (int)uVar15) {
                        uVar2 = uVar15;
                      }
                      uVar12 = iVar16 - (uint)bVar1;
                      uVar15 = -uVar12;
                      if (0 < (int)uVar12) {
                        uVar15 = uVar12;
                      }
                      uVar17 = iVar16 - (uint)bVar9;
                      uVar12 = -uVar17;
                      if (0 < (int)uVar17) {
                        uVar12 = uVar17;
                      }
                      if (uVar15 <= uVar12) {
                        bVar9 = bVar1;
                      }
                      if (uVar12 < uVar2) {
                        bVar14 = bVar9;
                      }
                      if (uVar15 < uVar2) {
                        bVar14 = bVar9;
                      }
                      uVar4 = puVar19[lVar24] - bVar14;
                      break;
                    case 5:
                      uVar4 = puVar19[lVar24] - (pixels[lVar24] >> 1);
                      break;
                    default:
                      goto switchD_001131dd_default;
                    }
                    *(uchar *)((long)__src + lVar24 + lVar7) = uVar4;
switchD_001131dd_default:
                    lVar24 = lVar24 + 1;
                  } while (sVar18 - lVar7 != lVar24);
                }
                if (iVar20 == 0) {
                  if ((int)uVar25 < 1) {
                    iVar5 = 0;
                  }
                  else {
                    uVar23 = 0;
                    iVar5 = 0;
                    do {
                      bVar14 = (char)*(byte *)((long)__src + uVar23) >> 7;
                      iVar5 = iVar5 + (uint)(byte)((*(byte *)((long)__src + uVar23) ^ bVar14) -
                                                  bVar14);
                      uVar23 = uVar23 + 1;
                    } while (uVar25 != uVar23);
                  }
                  if (iVar5 < local_cc) {
                    local_d8 = (int)lVar8;
                    local_cc = iVar5;
                  }
                }
              } while ((iVar20 == 0) && (bVar26 = lVar8 < 4, lVar8 = lVar8 + 1, bVar26));
            }
            bVar26 = iVar20 == 0;
            iVar20 = iVar20 + 1;
          } while (bVar26);
          lVar8 = uVar22 * (long)(int)(uVar25 + 1);
          puVar6[lVar8] = (uchar)local_d8;
          memcpy(puVar6 + lVar8 + 1,__src,sVar18);
          uVar22 = uVar22 + 1;
          lVar13 = lVar13 + lVar10;
          pixels = pixels + lVar10;
          puVar19 = puVar19 + lVar10;
          puVar11 = puVar11 + lVar10;
        } while (uVar22 != (uint)y);
      }
      free(__src);
      puVar19 = stbi_zlib_compress(puVar6,data_len,(int *)&local_3c,8);
      free(puVar6);
      sVar18 = (size_t)(int)local_3c;
      puVar6 = (uchar *)malloc(sVar18 + 0x39);
      if (puVar6 != (uchar *)0x0) {
        *out_len = (int)(sVar18 + 0x39);
        puVar6[0] = 0x89;
        puVar6[1] = 'P';
        puVar6[2] = 'N';
        puVar6[3] = 'G';
        puVar6[4] = '\r';
        puVar6[5] = '\n';
        puVar6[6] = '\x1a';
        puVar6[7] = '\n';
        puVar6[8] = '\0';
        puVar6[9] = '\0';
        puVar6[10] = '\0';
        puVar6[0xb] = '\r';
        puVar6[0xc] = 'I';
        puVar6[0xd] = 'H';
        puVar6[0xe] = 'D';
        puVar6[0xf] = 'R';
        puVar6[0x10] = (uchar)((uint)x >> 0x18);
        puVar6[0x11] = (uchar)((uint)x >> 0x10);
        puVar6[0x12] = (uchar)((uint)x >> 8);
        puVar6[0x13] = (uchar)x;
        puVar6[0x14] = (uchar)((uint)y >> 0x18);
        puVar6[0x15] = (uchar)((uint)y >> 0x10);
        puVar6[0x16] = (uchar)((uint)y >> 8);
        puVar6[0x17] = (uchar)y;
        puVar6[0x18] = '\b';
        puVar6[0x19] = (&DAT_00124120)[lVar7 * 4];
        puVar6[0x1a] = '\0';
        puVar6[0x1b] = '\0';
        local_38 = (uint *)(puVar6 + 0x1d);
        puVar6[0x1c] = '\0';
        stbiw__wpcrc((uchar **)&local_38,0xd);
        puVar3 = local_38;
        *local_38 = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                    local_3c << 0x18;
        local_38[1] = 0x54414449;
        local_38 = local_38 + 2;
        memmove(local_38,puVar19,sVar18);
        local_38 = (uint *)((long)puVar3 + sVar18 + 8);
        free(puVar19);
        stbiw__wpcrc((uchar **)&local_38,local_3c);
        *local_38 = 0;
        local_38[1] = 0x444e4549;
        local_38 = local_38 + 2;
        stbiw__wpcrc((uchar **)&local_38,0);
        if (local_38 == (uint *)(puVar6 + *out_len)) {
          return puVar6;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/stb_image_write.h"
                      ,0x3da,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}